

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderMaxTextureUnitsTest::GeometryShaderMaxTextureUnitsTest
          (GeometryShaderMaxTextureUnitsTest *this,Context *context,ExtParameters *extParams,
          char *name,char *description)

{
  TestCaseBase::TestCaseBase((TestCaseBase *)this,context,extParams,name,description);
  (this->super_GeometryShaderLimitsRenderingBase).m_fragment_shader_id = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_geometry_shader_id = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_program_object_id = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_vertex_shader_id = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_vertex_shader_id = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_framebuffer_object_id = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_color_texture_id = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_vertex_array_object_id = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_fragment_shader_parts = (GLchar **)0x0;
  (this->super_GeometryShaderLimitsRenderingBase).m_geometry_shader_parts = (GLchar **)0x0;
  (this->super_GeometryShaderLimitsRenderingBase).m_vertex_shader_parts = (GLchar **)0x0;
  (this->super_GeometryShaderLimitsRenderingBase).m_n_fragment_shader_parts = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_n_geometry_shader_parts = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_n_vertex_shader_parts = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_texture_format = 0x8058;
  (this->super_GeometryShaderLimitsRenderingBase).m_texture_height = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_texture_pixel_size = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_texture_read_format = 0x1908;
  (this->super_GeometryShaderLimitsRenderingBase).m_texture_read_type = 0x1401;
  (this->super_GeometryShaderLimitsRenderingBase).m_texture_width = 0;
  (this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__GeometryShaderMaxTextureUnitsTest_02156fd0;
  this->m_texture_width = 0;
  this->m_max_texture_units = 0;
  (this->m_max_texture_units_string)._M_dataplus._M_p =
       (pointer)&(this->m_max_texture_units_string).field_2;
  (this->m_max_texture_units_string)._M_string_length = 0;
  (this->m_max_texture_units_string).field_2._M_local_buf[0] = '\0';
  (this->m_textures).
  super__Vector_base<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_textures).
  super__Vector_base<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_textures).
  super__Vector_base<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

GeometryShaderMaxTextureUnitsTest::GeometryShaderMaxTextureUnitsTest(Context& context, const ExtParameters& extParams,
																	 const char* name, const char* description)
	: GeometryShaderLimitsRenderingBase(context, extParams, name, description)
	, m_texture_width(0)
	, m_max_texture_units(0)
{
	/* Nothing to be done here */
}